

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O3

void __thiscall
CoinSelection_SelectCoins_Simple_Error_outparameter_nullptr_Test::TestBody
          (CoinSelection_SelectCoins_Simple_Error_outparameter_nullptr_Test *this)

{
  bool bVar1;
  Amount AVar2;
  bool use_bnb;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_d0;
  Amount local_b8;
  Amount local_a8;
  long *local_98 [7];
  undefined **local_60;
  pointer local_58;
  pointer local_48;
  Amount fee;
  Amount select_value;
  
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(100000000);
  local_a8.amount_ = AVar2.amount_;
  local_a8.ignore_check_ = AVar2.ignore_check_;
  cfd::core::Amount::Amount(&select_value);
  cfd::core::Amount::Amount(&fee);
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_b8.amount_ = AVar2.amount_;
  local_b8.ignore_check_ = AVar2.ignore_check_;
  use_bnb = false;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    GetBitcoinUtxoList();
    GetBitcoinOption();
    cfd::CoinSelection::SelectCoins
              (&ret,&exp_selection,&local_a8,&local_d0,&exp_filter,(CoinSelectionOption *)local_98,
               &local_b8,(Amount *)0x0,&fee,&use_bnb);
    local_60 = &PTR__ConfidentialAssetId_0086dd08;
    if (local_58 != (pointer)0x0) {
      operator_delete(local_58,(long)local_48 - (long)local_58);
    }
    if (local_d0.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d0.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  testing::Message::Message((Message *)local_98);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&ret,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
             ,0x225,
             "Expected: std::vector<Utxo> ret = exp_selection.SelectCoins( target_amount, GetBitcoinUtxoList(), exp_filter, GetBitcoinOption(), tx_fee, nullptr, &fee, &use_bnb) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&ret,(Message *)local_98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ret);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98[0] !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98[0] !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*local_98[0] + 8))();
    }
  }
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_Error_outparameter_nullptr)
{
  Amount target_amount = Amount::CreateBySatoshiAmount(100000000);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;
  EXPECT_THROW(std::vector<Utxo> ret = exp_selection.SelectCoins(
      target_amount, GetBitcoinUtxoList(), exp_filter, GetBitcoinOption(),
      tx_fee, nullptr, &fee, &use_bnb), CfdException);
}